

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlElement::Print(TiXmlElement *this,FILE *cfile,int depth)

{
  TiXmlAttribute *pTVar1;
  TiXmlNode *pTVar2;
  int iVar3;
  TiXmlAttribute *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar4;
  TiXmlNode **ppTVar5;
  bool bVar6;
  
  if (cfile == (FILE *)0x0) {
    __assert_fail("cfile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0x323,"virtual void TiXmlElement::Print(FILE *, int) const");
  }
  iVar3 = 0;
  iVar4 = 0;
  if (0 < depth) {
    iVar3 = depth;
    iVar4 = depth;
  }
  while (iVar3 != 0) {
    fwrite("    ",4,1,(FILE *)cfile);
    iVar3 = iVar3 + -1;
  }
  fprintf((FILE *)cfile,"<%s",((this->super_TiXmlNode).value.rep_)->str);
  pTVar1 = (this->attributeSet).sentinel.next;
  this_00 = (TiXmlAttribute *)0x0;
  if (pTVar1 != &(this->attributeSet).sentinel) {
    this_00 = pTVar1;
  }
  for (; this_00 != (TiXmlAttribute *)0x0; this_00 = TiXmlAttribute::Next(this_00)) {
    fputc(0x20,(FILE *)cfile);
    (*(this_00->super_TiXmlBase)._vptr_TiXmlBase[2])(this_00,cfile,(ulong)(uint)depth);
  }
  pTVar2 = (this->super_TiXmlNode).firstChild;
  if (pTVar2 != (TiXmlNode *)0x0) {
    if ((pTVar2 == (this->super_TiXmlNode).lastChild) &&
       (iVar3 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[0xe])(),
       CONCAT44(extraout_var_00,iVar3) != 0)) {
      fputc(0x3e,(FILE *)cfile);
      pTVar2 = (this->super_TiXmlNode).firstChild;
      (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar2,cfile,(ulong)(depth + 1));
    }
    else {
      fputc(0x3e,(FILE *)cfile);
      ppTVar5 = &(this->super_TiXmlNode).firstChild;
      while (pTVar2 = *ppTVar5, pTVar2 != (TiXmlNode *)0x0) {
        iVar3 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[0xe])(pTVar2);
        if (CONCAT44(extraout_var,iVar3) == 0) {
          fputc(10,(FILE *)cfile);
        }
        (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[2])(pTVar2,cfile,(ulong)(depth + 1));
        ppTVar5 = &pTVar2->next;
      }
      fputc(10,(FILE *)cfile);
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        fwrite("    ",4,1,(FILE *)cfile);
      }
    }
    fprintf((FILE *)cfile,"</%s>",((this->super_TiXmlNode).value.rep_)->str);
    return;
  }
  fwrite(" />",3,1,(FILE *)cfile);
  return;
}

Assistant:

void TiXmlElement::Print( FILE* cfile, int depth ) const
{
	int i;
	assert( cfile );
	for ( i=0; i<depth; i++ ) {
		fprintf( cfile, "    " );
	}

	fprintf( cfile, "<%s", value.c_str() );

	const TiXmlAttribute* attrib;
	for ( attrib = attributeSet.First(); attrib; attrib = attrib->Next() )
	{
		fprintf( cfile, " " );
		attrib->Print( cfile, depth );
	}

	// There are 3 different formatting approaches:
	// 1) An element without children is printed as a <foo /> node
	// 2) An element with only a text child is printed as <foo> text </foo>
	// 3) An element with children is printed on multiple lines.
	TiXmlNode* node;
	if ( !firstChild )
	{
		fprintf( cfile, " />" );
	}
	else if ( firstChild == lastChild && firstChild->ToText() )
	{
		fprintf( cfile, ">" );
		firstChild->Print( cfile, depth + 1 );
		fprintf( cfile, "</%s>", value.c_str() );
	}
	else
	{
		fprintf( cfile, ">" );

		for ( node = firstChild; node; node=node->NextSibling() )
		{
			if ( !node->ToText() )
			{
				fprintf( cfile, "\n" );
			}
			node->Print( cfile, depth+1 );
		}
		fprintf( cfile, "\n" );
		for( i=0; i<depth; ++i ) {
			fprintf( cfile, "    " );
		}
		fprintf( cfile, "</%s>", value.c_str() );
	}
}